

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_> __thiscall Parser::parseStmt(Parser *this)

{
  Token *pTVar1;
  undefined1 auVar2 [8];
  undefined8 uVar3;
  Parser *in_RSI;
  long *plVar4;
  undefined1 local_b0 [8];
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined1 local_88 [40];
  undefined1 local_60 [48];
  
  pTVar1 = &in_RSI->m_currToken;
LAB_0010f4d0:
  switch(pTVar1->type) {
  case Def:
    eatToken(in_RSI,Def);
    Token::Token((Token *)local_60,pTVar1);
    eatToken(in_RSI,Identifier);
    eatToken(in_RSI,LeftParen);
    local_a8._0_8_ = (long *)0x0;
    local_a8._8_8_ = 0;
    local_98._M_allocated_capacity = 0;
    while (pTVar1->type != RightParen) {
      Token::Token((Token *)local_88,pTVar1);
      eatToken(in_RSI,Identifier);
      if (pTVar1->type != RightParen) {
        eatToken(in_RSI,Comma);
      }
      std::make_unique<AST::Identifier,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
      std::
      vector<std::unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>>,std::allocator<std::unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>>>>
      ::emplace_back<std::unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>>>
                ((vector<std::unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>>,std::allocator<std::unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>>>>
                  *)local_a8,
                 (unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_> *)local_b0);
      if (local_b0 != (undefined1  [8])0x0) {
        (*((Stmt *)local_b0)->_vptr_Stmt[1])();
      }
      std::__cxx11::string::~string((string *)(local_88 + 8));
    }
    eatToken(in_RSI,RightParen);
    parseBlockStmt((Parser *)local_88);
    std::make_unique<AST::Identifier,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_60 + 0x28));
    std::
    make_unique<AST::FnDecl,std::unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>>,std::vector<std::unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>>,std::allocator<std::unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>>>>,std::unique_ptr<AST::BlockStmt,std::default_delete<AST::BlockStmt>>>
              ((unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_> *)local_b0,
               (vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
                *)(local_60 + 0x28),
               (unique_ptr<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_> *)local_a8);
    auVar2 = local_b0;
    local_b0 = (undefined1  [8])0x0;
    (this->m_lexer).m_input._M_dataplus._M_p = (pointer)auVar2;
    if ((long *)local_60._40_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_60._40_8_ + 8))();
    }
    if ((long *)local_88._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 8))();
    }
    std::
    vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
    ::~vector((vector<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>,_std::allocator<std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>_>_>
               *)local_a8);
LAB_0010f8f9:
    std::__cxx11::string::~string((string *)(local_60 + 8));
    return (__uniq_ptr_data<AST::Stmt,_std::default_delete<AST::Stmt>,_true,_true>)
           (__uniq_ptr_data<AST::Stmt,_std::default_delete<AST::Stmt>,_true,_true>)this;
  case Let:
    eatToken(in_RSI,Let);
    Token::Token((Token *)local_60,pTVar1);
    eatToken(in_RSI,Identifier);
    eatToken(in_RSI,Equal);
    parseOrExpr((Parser *)local_88);
    std::make_unique<AST::Identifier,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
    std::
    make_unique<AST::LetStmt,std::unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>>,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>
              ((unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_> *)local_a8,
               (unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)local_b0);
    uVar3 = local_a8._0_8_;
    local_a8._0_8_ = (long *)0x0;
    (this->m_lexer).m_input._M_dataplus._M_p = (pointer)uVar3;
    plVar4 = (long *)local_88._0_8_;
    if ((_Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>)local_b0 != (Expr *)0x0) {
      (**(code **)((long)*(Stmt *)local_b0 + 8))();
      plVar4 = (long *)local_88._0_8_;
    }
    goto LAB_0010f7e9;
  default:
    parseOrExpr((Parser *)local_60);
    if ((in_RSI->m_currToken).type != Equal) {
      std::make_unique<AST::ExprStmt,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>
                ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)local_88);
      break;
    }
    eatToken(in_RSI,Equal);
    parseOrExpr((Parser *)local_88);
    std::
    make_unique<AST::AssignStmt,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>
              ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)local_a8,
               (unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)local_60);
    goto LAB_0010f972;
  case If:
  case Elif:
    eatToken(in_RSI,pTVar1->type);
    parseOrExpr((Parser *)local_60);
    parseBlockStmt((Parser *)local_88);
    if (pTVar1->type == Else) {
      eatToken(in_RSI,Else);
      parseBlockStmt((Parser *)local_a8);
      std::
      make_unique<AST::IfStmt,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>,std::unique_ptr<AST::BlockStmt,std::default_delete<AST::BlockStmt>>,std::unique_ptr<AST::BlockStmt,std::default_delete<AST::BlockStmt>>>
                ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)local_b0,
                 (unique_ptr<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_> *)local_60,
                 (unique_ptr<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_> *)local_88);
    }
    else {
      if (pTVar1->type != Elif) {
        local_b0 = (undefined1  [8])0x0;
        std::
        make_unique<AST::IfStmt,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>,std::unique_ptr<AST::BlockStmt,std::default_delete<AST::BlockStmt>>,decltype(nullptr)>
                  ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)local_a8,
                   (unique_ptr<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_> *)local_60,
                   (void **)local_88);
        goto LAB_0010f972;
      }
      parseStmt((Parser *)local_a8);
      std::
      make_unique<AST::IfStmt,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>,std::unique_ptr<AST::BlockStmt,std::default_delete<AST::BlockStmt>>,std::unique_ptr<AST::Stmt,std::default_delete<AST::Stmt>>>
                ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)local_b0,
                 (unique_ptr<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_> *)local_60,
                 (unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_> *)local_88);
    }
    (this->m_lexer).m_input._M_dataplus._M_p = (pointer)local_b0;
    if ((long *)local_a8._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
    goto LAB_0010f97a;
  case While:
    eatToken(in_RSI,While);
    parseOrExpr((Parser *)local_60);
    parseBlockStmt((Parser *)local_88);
    std::
    make_unique<AST::WhileStmt,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>,std::unique_ptr<AST::BlockStmt,std::default_delete<AST::BlockStmt>>>
              ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)local_a8,
               (unique_ptr<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_> *)local_60);
LAB_0010f972:
    (this->m_lexer).m_input._M_dataplus._M_p = (pointer)local_a8._0_8_;
LAB_0010f97a:
    if ((long *)local_88._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 8))();
    }
    goto LAB_0010f98a;
  case Return:
    eatToken(in_RSI,Return);
    parseOrExpr((Parser *)local_60);
    std::make_unique<AST::ReturnStmt,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>
              ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)local_88);
    break;
  case Next:
    eatToken(in_RSI,Next);
    std::make_unique<AST::NextStmt>();
    goto LAB_0010f815;
  case Break:
    eatToken(in_RSI,Break);
    std::make_unique<AST::BreakStmt>();
LAB_0010f815:
    (this->m_lexer).m_input._M_dataplus._M_p = (pointer)local_60._0_8_;
    return (__uniq_ptr_data<AST::Stmt,_std::default_delete<AST::Stmt>,_true,_true>)
           (__uniq_ptr_data<AST::Stmt,_std::default_delete<AST::Stmt>,_true,_true>)this;
  case Print:
    eatToken(in_RSI,Print);
    parseOrExpr((Parser *)local_60);
    std::make_unique<AST::PrintStmt,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>
              ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)local_88);
    break;
  case Scan:
    eatToken(in_RSI,Scan);
    Token::Token((Token *)local_60,pTVar1);
    eatToken(in_RSI,Identifier);
    std::make_unique<AST::Identifier,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
    std::
    make_unique<AST::ScanStmt,std::unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>>>
              ((unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_> *)local_88);
    uVar3 = local_88._0_8_;
    local_88._0_8_ = (long *)0x0;
    (this->m_lexer).m_input._M_dataplus._M_p = (pointer)uVar3;
    plVar4 = (long *)local_a8._0_8_;
LAB_0010f7e9:
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
    goto LAB_0010f8f9;
  case Err:
    eatToken(in_RSI,Err);
    parseOrExpr((Parser *)local_60);
    std::make_unique<AST::ErrStmt,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>
              ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)local_88);
    break;
  case EOL:
    goto switchD_0010f4e6_caseD_26;
  case END:
    (this->m_lexer).m_input._M_dataplus._M_p = (pointer)0x0;
    return (__uniq_ptr_data<AST::Stmt,_std::default_delete<AST::Stmt>,_true,_true>)
           (__uniq_ptr_data<AST::Stmt,_std::default_delete<AST::Stmt>,_true,_true>)this;
  }
  (this->m_lexer).m_input._M_dataplus._M_p = (pointer)local_88._0_8_;
LAB_0010f98a:
  if ((long *)local_60._0_8_ == (long *)0x0) {
    return (__uniq_ptr_data<AST::Stmt,_std::default_delete<AST::Stmt>,_true,_true>)
           (__uniq_ptr_data<AST::Stmt,_std::default_delete<AST::Stmt>,_true,_true>)this;
  }
  (**(code **)(*(long *)local_60._0_8_ + 8))();
  return (__uniq_ptr_data<AST::Stmt,_std::default_delete<AST::Stmt>,_true,_true>)
         (__uniq_ptr_data<AST::Stmt,_std::default_delete<AST::Stmt>,_true,_true>)this;
switchD_0010f4e6_caseD_26:
  eatToken(in_RSI,EOL);
  goto LAB_0010f4d0;
}

Assistant:

std::unique_ptr<AST::Stmt> Parser::parseStmt() {
    if (m_currToken.type == TokenType::END) {
        return nullptr;
    }
    if (m_currToken.type == TokenType::EOL) {
        eatToken(TokenType::EOL);
        return parseStmt();
    }
    if (m_currToken.type == TokenType::If || m_currToken.type == TokenType::Elif) {
        eatToken(m_currToken.type);
        auto cond = parseExpr();
        auto body = parseBlockStmt();

        if (m_currToken.type == TokenType::Elif) {
            auto falseBody = parseStmt();
            return std::make_unique<AST::IfStmt>(std::move(cond),
                                                 std::move(body),
                                                 std::move(falseBody));
        } else if (m_currToken.type == TokenType::Else) {
            eatToken(TokenType::Else);
            auto falseBody = parseBlockStmt();
            return std::make_unique<AST::IfStmt>(std::move(cond),
                                                 std::move(body),
                                                 std::move(falseBody));
        }

        return std::make_unique<AST::IfStmt>(std::move(cond), std::move(body), nullptr);
    }

    if (m_currToken.type == TokenType::While) {
        eatToken(TokenType::While);
        auto cond = parseExpr();
        auto body = parseBlockStmt();

        return std::make_unique<AST::WhileStmt>(std::move(cond), std::move(body));
    }

    if (m_currToken.type == TokenType::Next) {
        eatToken(TokenType::Next);
        return std::make_unique<AST::NextStmt>();
    }

    if (m_currToken.type == TokenType::Break) {
        eatToken(TokenType::Break);
        return std::make_unique<AST::BreakStmt>();
    }

    if (m_currToken.type == TokenType::Let) {
        eatToken(TokenType::Let);
        Token id = m_currToken;
        eatToken(TokenType::Identifier);
        eatToken(TokenType::Equal);
        auto val = parseExpr();
        return std::make_unique<AST::LetStmt>(std::make_unique<AST::Identifier>(id.literal), std::move(val));
    }

    if (m_currToken.type == TokenType::Print) {
        eatToken(TokenType::Print);
        auto expr = parseExpr();
        return std::make_unique<AST::PrintStmt>(std::move(expr));
    }

    if (m_currToken.type == TokenType::Err) {
        eatToken(TokenType::Err);
        auto expr = parseExpr();
        return std::make_unique<AST::ErrStmt>(std::move(expr));
    }

    if (m_currToken.type == TokenType::Scan) {
        eatToken(TokenType::Scan);
        Token id = m_currToken;
        eatToken(TokenType::Identifier);
        return std::make_unique<AST::ScanStmt>(std::make_unique<AST::Identifier>(id.literal));
    }

    if (m_currToken.type == TokenType::Def) {
        eatToken(TokenType::Def);
        Token id = m_currToken;
        eatToken(TokenType::Identifier);
        eatToken(TokenType::LeftParen);
        std::vector<std::unique_ptr<AST::Identifier>> params;
        while (m_currToken.type != TokenType::RightParen) {
            Token param = m_currToken;
            eatToken(TokenType::Identifier);
            if (m_currToken.type != TokenType::RightParen) {
                eatToken(TokenType::Comma);
            }
            params.push_back(std::make_unique<AST::Identifier>(param.literal));
        }
        eatToken(TokenType::RightParen);
        auto body = parseBlockStmt();
        return std::make_unique<AST::FnDecl>(std::make_unique<AST::Identifier>(id.literal),
                                             std::move(params),
                                             std::move(body));
    }

    if (m_currToken.type == TokenType::Return) {
        eatToken(TokenType::Return);
        std::unique_ptr<AST::Expr> expr = parseExpr();
        return std::make_unique<AST::ReturnStmt>(std::move(expr));
    }

    // assignment or expr statement
    std::unique_ptr<AST::Expr> expr = parseExpr();
    if (m_currToken.type == TokenType::Equal) {
        eatToken(TokenType::Equal);
        auto rval = parseExpr();
        // TODO: add checks that lval is valid.
        return std::make_unique<AST::AssignStmt>(std::move(expr), std::move(rval));
    } else {
        return std::make_unique<AST::ExprStmt>(std::move(expr));
    }
}